

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O1

flatcc_builder_ref_t * flatcc_builder_extend_offset_vector(flatcc_builder_t *B,size_t count)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (B->frame->container).table.pl_end;
  uVar4 = (uint)count;
  uVar3 = uVar1 + uVar4;
  if ((CARRY4(uVar1,uVar4)) || (0x3fffffff < uVar3)) {
    __assert_fail("n <= n1 && n1 <= max_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x391,
                  "int vector_count_add(flatcc_builder_t *, flatbuffers_uoffset_t, flatbuffers_uoffset_t)"
                 );
  }
  (B->frame->container).table.pl_end = uVar3;
  uVar1 = B->ds_offset;
  uVar3 = uVar1 + uVar4 * 4;
  B->ds_offset = uVar3;
  if ((B->ds_limit <= uVar3) && (iVar2 = reserve_ds(B,(ulong)(uVar3 + 1),0xfffffffc), iVar2 != 0)) {
    return (flatcc_builder_ref_t *)0x0;
  }
  return (flatcc_builder_ref_t *)(B->ds + uVar1);
}

Assistant:

static inline int vector_count_add(flatcc_builder_t *B, uoffset_t count, uoffset_t max_count)
{
    uoffset_t n, n1;
    n = frame(container.vector.count);
    n1 = n + count;
    /*
     * This prevents elem_size * count from overflowing iff max_vector
     * has been set sensible. Without this check we might allocate to
     * little on the ds stack and return a buffer the user thinks is
     * much larger which of course is bad even though the buffer eventually
     * would fail anyway.
     */
    check_error(n <= n1 && n1 <= max_count, -1, "vector too large to represent");
    frame(container.vector.count) = n1;
    return 0;
}